

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

void __thiscall
lf::fe::FeHierarchicQuad<double>::FeHierarchicQuad
          (FeHierarchicQuad<double> *this,uint interior_degree,array<unsigned_int,_4UL> edge_degrees
          ,QuadRuleCache *qr_cache,
          span<const_lf::mesh::Orientation,_18446744073709551615UL> rel_orient)

{
  uint uVar1;
  uint uVar2;
  QuadRule *pQVar3;
  uint *puVar4;
  long lVar5;
  bool bVar6;
  undefined8 local_38;
  undefined8 uStack_30;
  uint local_28;
  
  puVar4 = (uint *)&local_38;
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__FeHierarchicQuad_0036e840;
  this->interior_degree_ = interior_degree;
  *(long *)(this->edge_degrees_)._M_elems = edge_degrees._M_elems._0_8_;
  *(long *)((this->edge_degrees_)._M_elems + 2) = edge_degrees._M_elems._8_8_;
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,(RefEl)0x2,edge_degrees._M_elems[0] * 2 - 2);
  (this->qr_dual_edge_)._M_elems[0] = pQVar3;
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,(RefEl)0x2,(this->edge_degrees_)._M_elems[1] * 2 - 2);
  (this->qr_dual_edge_)._M_elems[1] = pQVar3;
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,(RefEl)0x2,(this->edge_degrees_)._M_elems[2] * 2 - 2);
  (this->qr_dual_edge_)._M_elems[2] = pQVar3;
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,(RefEl)0x2,(this->edge_degrees_)._M_elems[3] * 2 - 2);
  (this->qr_dual_edge_)._M_elems[3] = pQVar3;
  uVar2 = this->interior_degree_;
  local_38._0_4_ = this->interior_degree_;
  local_38._4_4_ = (this->edge_degrees_)._M_elems[0];
  uStack_30 = *(undefined8 *)((this->edge_degrees_)._M_elems + 1);
  local_28 = (this->edge_degrees_)._M_elems[3];
  lVar5 = 4;
  do {
    uVar1 = *(uint *)((long)&local_38 + lVar5);
    bVar6 = uVar2 < uVar1;
    if (uVar2 <= uVar1) {
      uVar2 = uVar1;
    }
    if (bVar6) {
      puVar4 = (uint *)((long)&local_38 + lVar5);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x14);
  uVar2 = *puVar4;
  (this->fe1d_).super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement =
       (_func_int **)&PTR__ScalarReferenceFiniteElement_0036e730;
  (this->fe1d_).degree_ = uVar2;
  pQVar3 = quad::QuadRuleCache::Get(qr_cache,(RefEl)0x2,uVar2 * 2 - 2);
  (this->fe1d_).qr_dual_ = pQVar3;
  (this->rel_orient_)._M_ptr = rel_orient._M_ptr;
  (this->rel_orient_)._M_extent._M_extent_value = rel_orient._M_extent._M_extent_value;
  return;
}

Assistant:

FeHierarchicQuad(unsigned interior_degree,
                   std::array<unsigned, 4> edge_degrees,
                   const quad::QuadRuleCache &qr_cache,
                   std::span<const lf::mesh::Orientation> rel_orient)
      : ScalarReferenceFiniteElement<SCALAR>(),
        interior_degree_(interior_degree),
        edge_degrees_(edge_degrees),
        qr_dual_edge_({&qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[0] - 1)),
                       &qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[1] - 1)),
                       &qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[2] - 1)),
                       &qr_cache.Get(lf::base::RefEl::kSegment(),
                                     2 * (edge_degrees_[3] - 1))}),
        rel_orient_(rel_orient),
        fe1d_(std::max({interior_degree_, edge_degrees_[0], edge_degrees_[1],
                        edge_degrees_[2], edge_degrees_[3]}),
              qr_cache) {
    LF_ASSERT_MSG(interior_degree_ >= 0, "illegal interior degree.");
    LF_ASSERT_MSG(edge_degrees_[0] >= 0, "illegal degree for edge 0");
    LF_ASSERT_MSG(edge_degrees_[1] >= 0, "illegal degree for edge 1");
    LF_ASSERT_MSG(edge_degrees_[2] >= 0, "illegal degree for edge 2");
    LF_ASSERT_MSG(edge_degrees_[3] >= 0, "illegal degree for edge 3");
  }